

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall
TTD::ScriptContextTTD::GetFromAsyncPendingList
          (ScriptContextTTD *this,TTDPendingAsyncBufferModification *pendingInfo,byte *finalModPos)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  Type *pTVar4;
  ArrayBuffer *pAVar5;
  undefined4 extraout_var;
  byte *pbVar6;
  undefined4 extraout_var_00;
  byte *pbuffMax;
  byte *pbuffBegin;
  ArrayBuffer *pbuff;
  TTDPendingAsyncBufferModification *pi;
  int32 i;
  int32 pos;
  byte *currentBegin;
  byte *finalModPos_local;
  TTDPendingAsyncBufferModification *pendingInfo_local;
  ScriptContextTTD *this_local;
  
  pendingInfo->ArrayBufferVar = (Var)0x0;
  pendingInfo->Index = 0;
  _i = (byte *)0x0;
  pi._4_4_ = -1;
  pi._0_4_ = 0;
  do {
    iVar2 = JsUtil::
            ReadOnlyList<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_DefaultComparer>
            ::Count(&(this->m_ttdPendingAsyncModList).
                     super_ReadOnlyList<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_DefaultComparer>
                   );
    if (iVar2 <= (int)pi) {
      if (pi._4_4_ != -1) {
        pTVar4 = JsUtil::
                 List<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(&this->m_ttdPendingAsyncModList,pi._4_4_);
        pendingInfo->ArrayBufferVar = pTVar4->ArrayBufferVar;
        uVar1 = *(undefined4 *)&pTVar4->field_0xc;
        pendingInfo->Index = pTVar4->Index;
        *(undefined4 *)&pendingInfo->field_0xc = uVar1;
        JsUtil::
        List<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::RemoveAt(&this->m_ttdPendingAsyncModList,pi._4_4_);
        return;
      }
      TTDAbort_unrecoverable_error("Missing matching register!!!");
    }
    pTVar4 = JsUtil::
             List<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(&this->m_ttdPendingAsyncModList,(int)pi);
    pAVar5 = Js::VarTo<Js::ArrayBuffer>(pTVar4->ArrayBufferVar);
    iVar2 = (*(pAVar5->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])();
    pbVar6 = (byte *)(CONCAT44(extraout_var,iVar2) + (ulong)pTVar4->Index);
    iVar2 = (*(pAVar5->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])();
    uVar3 = (*(pAVar5->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x71])();
    if ((pbVar6 <= finalModPos) &&
       (finalModPos <= (byte *)(CONCAT44(extraout_var_00,iVar2) + (ulong)uVar3))) {
      if (finalModPos == _i) {
        TTDAbort_unrecoverable_error("We have something strange!!!");
      }
      if ((_i == (byte *)0x0) || (finalModPos < _i)) {
        pi._4_4_ = (int)pi;
        _i = pbVar6;
      }
    }
    pi._0_4_ = (int)pi + 1;
  } while( true );
}

Assistant:

void ScriptContextTTD::GetFromAsyncPendingList(TTDPendingAsyncBufferModification* pendingInfo, byte* finalModPos)
    {
        pendingInfo->ArrayBufferVar = nullptr;
        pendingInfo->Index = 0;

        const byte* currentBegin = nullptr;
        int32 pos = -1;
        for(int32 i = 0; i < this->m_ttdPendingAsyncModList.Count(); ++i)
        {
            const TTDPendingAsyncBufferModification& pi = this->m_ttdPendingAsyncModList.Item(i);
            const Js::ArrayBuffer* pbuff = Js::VarTo<Js::ArrayBuffer>(pi.ArrayBufferVar);
            const byte* pbuffBegin = pbuff->GetBuffer() + pi.Index;
            const byte* pbuffMax = pbuff->GetBuffer() + pbuff->GetByteLength();

            //if the final mod is less than the start of this buffer + index or off then end then this definitely isn't it so skip
            if(pbuffBegin > finalModPos || pbuffMax < finalModPos)
            {
                continue;
            }

            //it is in the right range so now we assume non-overlapping so we see if this pbuffBegin is closer than the current best
            TTDAssert(finalModPos != currentBegin, "We have something strange!!!");
            if(currentBegin == nullptr || finalModPos < currentBegin)
            {
                currentBegin = pbuffBegin;
                pos = (int32)i;
            }
        }
        TTDAssert(pos != -1, "Missing matching register!!!");

        *pendingInfo = this->m_ttdPendingAsyncModList.Item(pos);
        this->m_ttdPendingAsyncModList.RemoveAt(pos);
    }